

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  Curl_llist *list;
  byte *pbVar1;
  connectdata *pcVar2;
  WildcardData *pWVar3;
  FILEPROTO *pFVar4;
  curl_chunk_bgn_callback p_Var5;
  void *pvVar6;
  WildcardData *pWVar7;
  curl_trc_feat *pcVar8;
  connectdata *pcVar9;
  bool bVar10;
  uchar uVar11;
  byte bVar12;
  _Bool connected;
  CURLcode CVar13;
  CURLcode CVar14;
  int iVar15;
  Curl_llist_node *pCVar16;
  size_t sVar17;
  undefined8 *puVar18;
  long lVar19;
  char *pcVar20;
  ftp_wc *pfVar21;
  ftp_parselist_data *pfVar22;
  char *pcVar23;
  CURLcode unaff_EBP;
  Curl_cwriter *ftp_lc_writer;
  Curl_cwriter *local_40;
  _Bool *local_38;
  
  pcVar2 = data->conn;
  *done = false;
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xdf;
  CVar13 = Curl_cwriter_create(&local_40,data,&ftp_cw_lc,CURL_CW_CONTENT_DECODE);
  if (CVar13 == CURLE_OK) {
    CVar13 = Curl_cwriter_add(data,local_40);
    if (CVar13 != CURLE_OK) {
      Curl_cwriter_free(data,local_40);
      goto LAB_0012a3f6;
    }
    bVar10 = true;
  }
  else {
LAB_0012a3f6:
    bVar10 = false;
    unaff_EBP = CVar13;
  }
  if (!bVar10) {
    return unaff_EBP;
  }
  if (((data->state).field_0x7bf & 1) != 0) {
    pWVar3 = data->wildcard;
    pcVar2 = data->conn;
    list = &pWVar3->filelist;
    CVar13 = CURLE_OK;
    local_38 = done;
switchD_0012a455_default:
    switch(pWVar3->state) {
    case '\0':
    case '\x06':
    case '\a':
      goto switchD_0012a455_caseD_0;
    case '\x01':
      pFVar4 = (data->req).p.file;
      pcVar23 = pFVar4->path;
      pWVar7 = data->wildcard;
      pcVar20 = strrchr(pcVar23,0x2f);
      if (pcVar20 == (char *)0x0) {
        if (*pcVar23 != '\0') {
          pcVar20 = (*Curl_cstrdup)(pcVar23);
          pWVar7->pattern = pcVar20;
          goto LAB_0012a7e7;
        }
LAB_0012a8ee:
        pWVar7->state = '\x04';
        unaff_EBP = ftp_parse_url_path(data);
      }
      else {
        if (pcVar20[1] == '\0') goto LAB_0012a8ee;
        pcVar23 = pcVar20 + 1;
        pcVar20 = (*Curl_cstrdup)(pcVar23);
        pWVar7->pattern = pcVar20;
LAB_0012a7e7:
        if (pcVar20 == (char *)0x0) {
          unaff_EBP = CURLE_OUT_OF_MEMORY;
        }
        else {
          *pcVar23 = '\0';
          pfVar21 = (ftp_wc *)(*Curl_ccalloc)(1,0x18);
          unaff_EBP = CURLE_OUT_OF_MEMORY;
          if (pfVar21 != (ftp_wc *)0x0) {
            pfVar22 = Curl_ftp_parselist_data_alloc();
            pfVar21->parser = pfVar22;
            if (pfVar22 != (ftp_parselist_data *)0x0) {
              pWVar7->ftpwc = pfVar21;
              pWVar7->dtor = wc_data_dtor;
              if ((data->set).ftp_filemethod == '\x02') {
                (data->set).ftp_filemethod = '\x01';
              }
              unaff_EBP = ftp_parse_url_path(data);
              if (unaff_EBP == CURLE_OK) {
                pcVar23 = (*Curl_cstrdup)(pFVar4->path);
                pWVar7->path = pcVar23;
                unaff_EBP = CURLE_OUT_OF_MEMORY;
                if (pcVar23 != (char *)0x0) {
                  unaff_EBP = CURLE_OK;
                  (pfVar21->backup).write_function = (data->set).fwrite_func;
                  (data->set).fwrite_func = Curl_ftp_parselist;
                  (pfVar21->backup).file_descriptor = (FILE *)(data->set).out;
                  (data->set).out = data;
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar8->log_level)))) {
                    unaff_EBP = CURLE_OK;
                    Curl_infof(data,"Wildcard - Parsing started");
                  }
                  goto LAB_0012a944;
                }
              }
            }
          }
          if (pfVar21 != (ftp_wc *)0x0) {
            Curl_ftp_parselist_data_free((ftp_parselist_data **)pfVar21);
            (*Curl_cfree)(pfVar21);
          }
          (*Curl_cfree)(pWVar7->pattern);
          pWVar7->pattern = (char *)0x0;
          pWVar7->ftpwc = (ftp_wc *)0x0;
          pWVar7->dtor = (wildcard_dtor)0x0;
        }
      }
LAB_0012a944:
      if (pWVar3->state == '\x04') goto LAB_0012a959;
      bVar12 = (unaff_EBP != CURLE_OK) << 2 | 2;
      break;
    case '\x02':
      pfVar21 = pWVar3->ftpwc;
      (data->set).fwrite_func = (pfVar21->backup).write_function;
      (data->set).out = (pfVar21->backup).file_descriptor;
      (pfVar21->backup).write_function = (curl_write_callback)0x0;
      (pfVar21->backup).file_descriptor = (FILE *)0x0;
      pWVar3->state = '\x03';
      CVar14 = Curl_ftp_parselist_geterror(pfVar21->parser);
      if (CVar14 == CURLE_OK) {
        sVar17 = Curl_llist_count(list);
        bVar10 = true;
        if (sVar17 == 0) {
          unaff_EBP = CURLE_REMOTE_FILE_NOT_FOUND;
          goto LAB_0012a4ed;
        }
      }
      else {
LAB_0012a4ed:
        pWVar3->state = '\x04';
        bVar10 = CVar14 != CURLE_OK;
      }
      if (!bVar10) goto LAB_0012a959;
      goto switchD_0012a455_default;
    case '\x03':
      pCVar16 = Curl_llist_head(list);
      puVar18 = (undefined8 *)Curl_node_elem(pCVar16);
      pFVar4 = (data->req).p.file;
      pcVar23 = curl_maprintf("%s%s",pWVar3->path,*puVar18);
      iVar15 = 1;
      if (pcVar23 == (char *)0x0) {
        unaff_EBP = CURLE_OUT_OF_MEMORY;
      }
      else {
        (*Curl_cfree)(pFVar4->freepath);
        pFVar4->path = pcVar23;
        pFVar4->freepath = pcVar23;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))
           )) {
          Curl_infof(data,"Wildcard - START of \"%s\"",*puVar18);
        }
        if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
          Curl_set_in_callback(data,true);
          p_Var5 = (data->set).chunk_bgn;
          pvVar6 = (data->set).wildcardptr;
          sVar17 = Curl_llist_count(list);
          lVar19 = (*p_Var5)(puVar18,pvVar6,(int)sVar17);
          Curl_set_in_callback(data,false);
          if (lVar19 == 1) {
            unaff_EBP = CURLE_CHUNK_FAILED;
            iVar15 = 1;
LAB_0012a6ab:
            bVar10 = false;
          }
          else {
            if (lVar19 == 2) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar8->log_level)))) {
                Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar18);
              }
              pWVar3->state = '\x05';
              iVar15 = 3;
              goto LAB_0012a6ab;
            }
            iVar15 = 0;
            bVar10 = true;
          }
          if (!bVar10) goto LAB_0012a72d;
        }
        if (*(int *)(puVar18 + 1) == 0) {
          if ((*(byte *)(puVar18 + 0xc) & 0x40) != 0) {
            (pcVar2->proto).ftpc.known_filesize = puVar18[5];
          }
          unaff_EBP = ftp_parse_url_path(data);
          iVar15 = 1;
          CVar13 = unaff_EBP;
          if (unaff_EBP == CURLE_OK) {
            pCVar16 = Curl_llist_head(list);
            Curl_node_remove(pCVar16);
            sVar17 = Curl_llist_count(list);
            CVar13 = CURLE_OK;
            iVar15 = 1;
            if (sVar17 == 0) {
              uVar11 = '\x04';
              unaff_EBP = CURLE_OK;
              goto LAB_0012a6ce;
            }
            unaff_EBP = CURLE_OK;
          }
        }
        else {
          iVar15 = 3;
          uVar11 = '\x05';
LAB_0012a6ce:
          pWVar3->state = uVar11;
        }
      }
LAB_0012a72d:
      if (iVar15 != 3) goto LAB_0012a959;
      goto switchD_0012a455_default;
    case '\x04':
      if (pWVar3->ftpwc == (ftp_wc *)0x0) {
        unaff_EBP = CURLE_OK;
      }
      else {
        unaff_EBP = Curl_ftp_parselist_geterror(pWVar3->ftpwc->parser);
      }
      bVar12 = unaff_EBP == CURLE_OK | 6;
      break;
    case '\x05':
      goto switchD_0012a455_caseD_5;
    default:
      goto switchD_0012a455_default;
    }
    pWVar3->state = bVar12;
    goto LAB_0012a959;
  }
  unaff_EBP = ftp_parse_url_path(data);
joined_r0x0012a97a:
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pcVar2 = data->conn;
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 | 4;
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
     (((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    if (data->conn == (connectdata *)0x0) {
      pcVar23 = "???";
    }
    else {
      pcVar23 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] DO phase starts",pcVar23);
  }
  if (((data->req).field_0xd3 & 2) != 0) {
    ((data->req).p.file)->fd = 1;
  }
  *done = false;
  CVar13 = ftp_state_quote(data,true,'\f');
  if (CVar13 == CURLE_OK) {
    pcVar9 = data->conn;
    CVar13 = Curl_pp_statemach(data,&(pcVar9->proto).ftpc.pp,false,false);
    *done = (pcVar9->proto).ftpc.state == '\0';
    connected = Curl_conn_is_connected(data->conn,1);
    if (connected) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        if (data->conn == (connectdata *)0x0) {
          pcVar23 = "???";
        }
        else {
          pcVar23 = ftp_state_names[(data->conn->proto).ftpc.state];
        }
        Curl_infof(data,"[FTP] [%s] perform, DATA connection established",pcVar23);
      }
    }
    else if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
              (0 < pcVar8->log_level)))) && (0 < Curl_trc_feat_ftp.log_level)) {
      if (data->conn == (connectdata *)0x0) {
        pcVar23 = "???";
      }
      else {
        pcVar23 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] perform, awaiting DATA connect",pcVar23);
    }
    if ((((data != (Curl_easy *)0x0) && (*done != false)) && (((data->set).field_0x89f & 0x40) != 0)
        ) && (((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
               (0 < pcVar8->log_level)) && (0 < Curl_trc_feat_ftp.log_level)))) {
      if (data->conn == (connectdata *)0x0) {
        pcVar23 = "???";
      }
      else {
        pcVar23 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] DO phase is complete1",pcVar23);
    }
  }
  else {
    connected = false;
  }
  if (CVar13 == CURLE_OK) {
    if (*done != true) {
      return CURLE_OK;
    }
    CVar13 = ftp_dophase_done(data,connected);
    return CVar13;
  }
  freedirs(&(pcVar2->proto).ftpc);
  return CVar13;
switchD_0012a455_caseD_5:
  if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
    Curl_set_in_callback(data,true);
    (*(data->set).chunk_end)((data->set).wildcardptr);
    Curl_set_in_callback(data,false);
  }
  pCVar16 = Curl_llist_head(list);
  Curl_node_remove(pCVar16);
  sVar17 = Curl_llist_count(list);
  pWVar3->state = (sVar17 == 0) + '\x03';
  goto switchD_0012a455_default;
switchD_0012a455_caseD_0:
  unaff_EBP = CVar13;
  if (pWVar3->dtor != (wildcard_dtor)0x0) {
    (*pWVar3->dtor)(pWVar3->ftpwc);
    pWVar3->ftpwc = (ftp_wc *)0x0;
  }
LAB_0012a959:
  done = local_38;
  if ((data->wildcard->state | 2) == 7) {
    return CURLE_OK;
  }
  goto joined_r0x0012a97a;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

#ifdef CURL_PREFER_LF_LINEENDS
  {
    /* FTP data may need conversion. */
    struct Curl_cwriter *ftp_lc_writer;

    result = Curl_cwriter_create(&ftp_lc_writer, data, &ftp_cw_lc,
                                 CURL_CW_CONTENT_DECODE);
    if(result)
      return result;

    result = Curl_cwriter_add(data, ftp_lc_writer);
    if(result) {
      Curl_cwriter_free(data, ftp_lc_writer);
      return result;
    }
  }
#endif /* CURL_PREFER_LF_LINEENDS */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard->state == CURLWC_SKIP ||
       data->wildcard->state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}